

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assembler.cpp
# Opt level: O3

string * Assembler::rType(string *__return_storage_ptr__,string *operation,int line)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  long *plVar7;
  undefined8 uVar8;
  int iVar9;
  undefined1 *puVar10;
  long *plVar11;
  size_type *psVar12;
  long **pplVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  string func;
  string shift;
  string rt;
  string rd;
  string rs;
  string opcode;
  string local_2a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  undefined1 *local_270;
  undefined8 local_268;
  undefined1 local_260 [16];
  undefined1 *local_250;
  undefined8 local_248;
  undefined1 local_240 [16];
  undefined1 *local_230;
  undefined8 local_228;
  undefined1 local_220 [16];
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  undefined1 local_190 [32];
  string local_170;
  string local_150;
  string local_130;
  undefined1 local_110 [32];
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"(\\s|,)+","");
  HelpFuncts::split(&local_288,operation,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pcVar2 = ((local_288.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar2,
             pcVar2 + (local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
  AsmFuncts::getOpCode(&local_70,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  local_210 = local_200;
  local_208 = 0;
  local_200[0] = 0;
  local_230 = local_220;
  local_228 = 0;
  local_220[0] = 0;
  local_250 = local_240;
  local_248 = 0;
  local_240[0] = 0;
  puVar10 = local_260;
  local_268 = 0;
  local_260[0] = 0;
  local_270 = puVar10;
  iVar4 = std::__cxx11::string::compare
                    ((char *)local_288.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  iVar9 = (int)puVar10;
  if ((iVar4 == 0) ||
     (iVar4 = std::__cxx11::string::compare
                        ((char *)local_288.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start), iVar4 == 0)) {
    Conversion::decToBin_abi_cxx11_(&local_2a8,(Conversion *)0x0,5,iVar9);
    std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_2a8);
    paVar1 = &local_2a8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    pcVar2 = local_288.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar2,
               pcVar2 + local_288.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length);
    AsmFuncts::getRegCode(&local_2a8,&local_d0);
    std::__cxx11::string::operator=((string *)&local_230,(string *)&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    pcVar2 = local_288.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar2,
               pcVar2 + local_288.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
    AsmFuncts::getRegCode(&local_2a8,&local_f0);
    std::__cxx11::string::operator=((string *)&local_210,(string *)&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    plVar7 = (long *)local_288.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
    piVar5 = __errno_location();
    iVar4 = *piVar5;
    *piVar5 = 0;
    uVar6 = strtol((char *)plVar7,(char **)&local_1d0,10);
    if (local_1d0 == plVar7) {
      std::__throw_invalid_argument("stoi");
LAB_00116841:
      uVar8 = std::__throw_out_of_range("stoi");
      if ((long **)local_190._0_8_ != &local_1d0) {
        operator_delete((void *)local_190._0_8_);
      }
      if (local_270 != local_260) {
        operator_delete(local_270);
      }
      if (local_250 != local_240) {
        operator_delete(local_250);
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
      if (local_210 != local_200) {
        operator_delete(local_210);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_288);
      _Unwind_Resume(uVar8);
    }
    if (((long)(int)uVar6 != uVar6) || (iVar9 = *piVar5, iVar9 == 0x22)) goto LAB_00116841;
    if (iVar9 == 0) {
      *piVar5 = iVar4;
    }
    Conversion::decToBin_abi_cxx11_(&local_2a8,(Conversion *)(uVar6 & 0xffffffff),5,iVar9);
    std::__cxx11::string::operator=((string *)&local_250,(string *)&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    pcVar2 = ((local_288.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    local_110._0_8_ = local_110 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_110,pcVar2,
               pcVar2 + (local_288.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    AsmFuncts::getFuncCode(&local_2a8,(string *)local_110);
    std::__cxx11::string::operator=((string *)&local_270,(string *)&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    pplVar13 = (long **)local_110._0_8_;
    if ((undefined1 *)local_110._0_8_ == local_110 + 0x10) goto LAB_001165b7;
  }
  else {
    pcVar2 = local_288.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar2,
               pcVar2 + local_288.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length);
    AsmFuncts::getRegCode(&local_2a8,&local_130);
    std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_2a8);
    paVar1 = &local_2a8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    pcVar2 = local_288.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,pcVar2,
               pcVar2 + local_288.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[3]._M_string_length);
    AsmFuncts::getRegCode(&local_2a8,&local_150);
    std::__cxx11::string::operator=((string *)&local_230,(string *)&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    pcVar2 = local_288.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,pcVar2,
               pcVar2 + local_288.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
    AsmFuncts::getRegCode(&local_2a8,&local_170);
    std::__cxx11::string::operator=((string *)&local_210,(string *)&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    Conversion::decToBin_abi_cxx11_(&local_2a8,(Conversion *)0x0,5,iVar9);
    std::__cxx11::string::operator=((string *)&local_250,(string *)&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    pcVar2 = ((local_288.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    local_190._0_8_ = local_190 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_190,pcVar2,
               pcVar2 + (local_288.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    AsmFuncts::getFuncCode(&local_2a8,(string *)local_190);
    std::__cxx11::string::operator=((string *)&local_270,(string *)&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    pplVar13 = (long **)local_190._0_8_;
    if ((undefined1 *)local_190._0_8_ == local_190 + 0x10) goto LAB_001165b7;
  }
  operator_delete(pplVar13);
LAB_001165b7:
  std::operator+(&local_90,&local_70,&local_1f0);
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_230);
  plVar11 = plVar7 + 2;
  if ((long *)*plVar7 == plVar11) {
    local_1a0 = *plVar11;
    lStack_198 = plVar7[3];
    local_1b0 = &local_1a0;
  }
  else {
    local_1a0 = *plVar11;
    local_1b0 = (long *)*plVar7;
  }
  local_1a8 = plVar7[1];
  *plVar7 = (long)plVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_210);
  plVar11 = plVar7 + 2;
  if ((long *)*plVar7 == plVar11) {
    local_1c0 = *plVar11;
    lStack_1b8 = plVar7[3];
    local_1d0 = &local_1c0;
  }
  else {
    local_1c0 = *plVar11;
    local_1d0 = (long *)*plVar7;
  }
  local_1c8 = plVar7[1];
  *plVar7 = (long)plVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_250);
  psVar12 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_2a8.field_2._M_allocated_capacity = *psVar12;
    local_2a8.field_2._8_8_ = plVar7[3];
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  }
  else {
    local_2a8.field_2._M_allocated_capacity = *psVar12;
    local_2a8._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_2a8._M_string_length = plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_270);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar12 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar12) {
    lVar3 = plVar7[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
  }
  __return_storage_ptr__->_M_string_length = plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_270 != local_260) {
    operator_delete(local_270);
  }
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  if (local_230 != local_220) {
    operator_delete(local_230);
  }
  if (local_210 != local_200) {
    operator_delete(local_210);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288);
  return __return_storage_ptr__;
}

Assistant:

string Assembler::rType(string operation, int line){
    vector<string> v = HelpFuncts::split(operation,"(\\s|,)+");
    string opcode = AsmFuncts::getOpCode(v[0]);
    string rs,rd,rt,shift,func;
    if((v[0] == "sll") || (v[0] == "srl")){
        rs = Conversion::decToBin(0,5);
        rt = AsmFuncts::getRegCode(v[2]);
        rd = AsmFuncts::getRegCode(v[1]);
        shift = Conversion::decToBin(stoi(v[3]),5);
        func = AsmFuncts::getFuncCode(v[0]);
    }else{
        rs = AsmFuncts::getRegCode(v[2]);
        rt = AsmFuncts::getRegCode(v[3]);
        rd = AsmFuncts::getRegCode(v[1]);
        shift = Conversion::decToBin(0,5);
        func = AsmFuncts::getFuncCode(v[0]);
    }
    return (opcode + rs + rt + rd + shift + func);
}